

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pololu.h
# Opt level: O2

int GetTelemetersPololu(POLOLU *pPololu,double *pDist1,double *pDist2,double *pDist3,double *pDist4,
                       double *pDist5,double *pDist6,double *pDist7,double *pDist8,double *pDist9,
                       double *pDist10,double *pDist11,double *pDist12)

{
  int iVar1;
  int iVar2;
  int ais [24];
  int selectedchannels [24];
  
  selectedchannels[0] = 0;
  selectedchannels[1] = 0;
  selectedchannels[2] = 0;
  selectedchannels[3] = 0;
  selectedchannels[4] = 0;
  selectedchannels[5] = 0;
  selectedchannels[6] = 0;
  selectedchannels[7] = 0;
  selectedchannels[8] = 0;
  selectedchannels[9] = 0;
  selectedchannels[10] = 0;
  selectedchannels[0xb] = 0;
  selectedchannels[0xc] = 0;
  selectedchannels[0xd] = 0;
  selectedchannels[0xe] = 0;
  selectedchannels[0xf] = 0;
  selectedchannels[0x10] = 0;
  selectedchannels[0x11] = 0;
  selectedchannels[0x12] = 0;
  selectedchannels[0x13] = 0;
  selectedchannels[0x14] = 0;
  selectedchannels[0x15] = 0;
  selectedchannels[0x16] = 0;
  selectedchannels[0x17] = 0;
  ais[0] = 0;
  ais[1] = 0;
  ais[2] = 0;
  ais[3] = 0;
  ais[4] = 0;
  ais[5] = 0;
  ais[6] = 0;
  ais[7] = 0;
  ais[8] = 0;
  ais[9] = 0;
  ais[10] = 0;
  ais[0xb] = 0;
  ais[0xc] = 0;
  ais[0xd] = 0;
  ais[0xe] = 0;
  ais[0xf] = 0;
  ais[0x10] = 0;
  ais[0x11] = 0;
  ais[0x12] = 0;
  ais[0x13] = 0;
  ais[0x14] = 0;
  ais[0x15] = 0;
  ais[0x16] = 0;
  ais[0x17] = 0;
  selectedchannels[pPololu->telem1analoginputchan] = 1;
  selectedchannels[pPololu->telem2analoginputchan] = 1;
  selectedchannels[pPololu->telem3analoginputchan] = 1;
  selectedchannels[pPololu->telem4analoginputchan] = 1;
  selectedchannels[pPololu->telem5analoginputchan] = 1;
  selectedchannels[pPololu->telem6analoginputchan] = 1;
  selectedchannels[pPololu->telem7analoginputchan] = 1;
  selectedchannels[pPololu->telem8analoginputchan] = 1;
  selectedchannels[pPololu->telem9analoginputchan] = 1;
  selectedchannels[pPololu->telem10analoginputchan] = 1;
  selectedchannels[pPololu->telem11analoginputchan] = 1;
  selectedchannels[pPololu->telem12analoginputchan] = 1;
  iVar2 = GetAllValuesPololu(pPololu,selectedchannels,ais);
  if (iVar2 == 0) {
    iVar1 = pPololu->telem1analoginputchan;
    *pDist1 = ((double)ais[iVar1] * pPololu->analoginputcoef[iVar1] * 5.0) / 1023.0 +
              pPololu->analoginputoffset[iVar1];
    iVar1 = pPololu->telem2analoginputchan;
    *pDist2 = ((double)ais[iVar1] * pPololu->analoginputcoef[iVar1] * 5.0) / 1023.0 +
              pPololu->analoginputoffset[iVar1];
    iVar1 = pPololu->telem3analoginputchan;
    *pDist3 = ((double)ais[iVar1] * pPololu->analoginputcoef[iVar1] * 5.0) / 1023.0 +
              pPololu->analoginputoffset[iVar1];
    iVar1 = pPololu->telem4analoginputchan;
    *pDist4 = ((double)ais[iVar1] * pPololu->analoginputcoef[iVar1] * 5.0) / 1023.0 +
              pPololu->analoginputoffset[iVar1];
    iVar1 = pPololu->telem5analoginputchan;
    *pDist5 = ((double)ais[iVar1] * pPololu->analoginputcoef[iVar1] * 5.0) / 1023.0 +
              pPololu->analoginputoffset[iVar1];
    iVar1 = pPololu->telem6analoginputchan;
    *pDist6 = ((double)ais[iVar1] * pPololu->analoginputcoef[iVar1] * 5.0) / 1023.0 +
              pPololu->analoginputoffset[iVar1];
    iVar1 = pPololu->telem7analoginputchan;
    *pDist7 = ((double)ais[iVar1] * pPololu->analoginputcoef[iVar1] * 5.0) / 1023.0 +
              pPololu->analoginputoffset[iVar1];
    iVar1 = pPololu->telem8analoginputchan;
    *pDist8 = ((double)ais[iVar1] * pPololu->analoginputcoef[iVar1] * 5.0) / 1023.0 +
              pPololu->analoginputoffset[iVar1];
    iVar1 = pPololu->telem9analoginputchan;
    *pDist9 = ((double)ais[iVar1] * pPololu->analoginputcoef[iVar1] * 5.0) / 1023.0 +
              pPololu->analoginputoffset[iVar1];
    iVar1 = pPololu->telem10analoginputchan;
    *pDist10 = ((double)ais[iVar1] * pPololu->analoginputcoef[iVar1] * 5.0) / 1023.0 +
               pPololu->analoginputoffset[iVar1];
    iVar1 = pPololu->telem11analoginputchan;
    *pDist11 = ((double)ais[iVar1] * pPololu->analoginputcoef[iVar1] * 5.0) / 1023.0 +
               pPololu->analoginputoffset[iVar1];
    iVar1 = pPololu->telem12analoginputchan;
    *pDist12 = ((double)ais[iVar1] * pPololu->analoginputcoef[iVar1] * 5.0) / 1023.0 +
               pPololu->analoginputoffset[iVar1];
  }
  return (uint)(iVar2 != 0);
}

Assistant:

inline int GetTelemetersPololu(POLOLU* pPololu, double* pDist1, double* pDist2, double* pDist3, double* pDist4, double* pDist5, double* pDist6, double* pDist7, double* pDist8, double* pDist9, double* pDist10, double* pDist11, double* pDist12)
{
	int selectedchannels[NB_CHANNELS_AI_POLOLU];
	int ais[NB_CHANNELS_AI_POLOLU];
	int i = 0;

	memset(selectedchannels, 0, sizeof(selectedchannels));
	memset(ais, 0, sizeof(ais));

	selectedchannels[pPololu->telem1analoginputchan] = 1;
	selectedchannels[pPololu->telem2analoginputchan] = 1;
	selectedchannels[pPololu->telem3analoginputchan] = 1;
	selectedchannels[pPololu->telem4analoginputchan] = 1;
	selectedchannels[pPololu->telem5analoginputchan] = 1;
	selectedchannels[pPololu->telem6analoginputchan] = 1;
	selectedchannels[pPololu->telem7analoginputchan] = 1;
	selectedchannels[pPololu->telem8analoginputchan] = 1;
	selectedchannels[pPololu->telem9analoginputchan] = 1;
	selectedchannels[pPololu->telem10analoginputchan] = 1;
	selectedchannels[pPololu->telem11analoginputchan] = 1;
	selectedchannels[pPololu->telem12analoginputchan] = 1;

	if (GetAllValuesPololu(pPololu, selectedchannels, ais) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}

	i = pPololu->telem1analoginputchan;
	*pDist1 = pPololu->analoginputcoef[i]*ais[i]*5.0/1023.0+pPololu->analoginputoffset[i];
	i = pPololu->telem2analoginputchan;
	*pDist2 = pPololu->analoginputcoef[i]*ais[i]*5.0/1023.0+pPololu->analoginputoffset[i];
	i = pPololu->telem3analoginputchan;
	*pDist3 = pPololu->analoginputcoef[i]*ais[i]*5.0/1023.0+pPololu->analoginputoffset[i];
	i = pPololu->telem4analoginputchan;
	*pDist4 = pPololu->analoginputcoef[i]*ais[i]*5.0/1023.0+pPololu->analoginputoffset[i];
	i = pPololu->telem5analoginputchan;
	*pDist5 = pPololu->analoginputcoef[i]*ais[i]*5.0/1023.0+pPololu->analoginputoffset[i];
	i = pPololu->telem6analoginputchan;
	*pDist6 = pPololu->analoginputcoef[i]*ais[i]*5.0/1023.0+pPololu->analoginputoffset[i];
	i = pPololu->telem7analoginputchan;
	*pDist7 = pPololu->analoginputcoef[i]*ais[i]*5.0/1023.0+pPololu->analoginputoffset[i];
	i = pPololu->telem8analoginputchan;
	*pDist8 = pPololu->analoginputcoef[i]*ais[i]*5.0/1023.0+pPololu->analoginputoffset[i];
	i = pPololu->telem9analoginputchan;
	*pDist9 = pPololu->analoginputcoef[i]*ais[i]*5.0/1023.0+pPololu->analoginputoffset[i];
	i = pPololu->telem10analoginputchan;
	*pDist10 = pPololu->analoginputcoef[i]*ais[i]*5.0/1023.0+pPololu->analoginputoffset[i];
	i = pPololu->telem11analoginputchan;
	*pDist11 = pPololu->analoginputcoef[i]*ais[i]*5.0/1023.0+pPololu->analoginputoffset[i];
	i = pPololu->telem12analoginputchan;
	*pDist12 = pPololu->analoginputcoef[i]*ais[i]*5.0/1023.0+pPololu->analoginputoffset[i];

	return EXIT_SUCCESS;
}